

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

char * __thiscall MemIStream::readMemoryMapped(MemIStream *this,int n)

{
  uint64_t uVar1;
  pointer pcVar2;
  runtime_error *this_00;
  ulong uVar3;
  
  uVar1 = this->streamptr;
  uVar3 = (long)n + uVar1;
  pcVar2 = (this->ostream->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar3 <= (ulong)((long)(this->ostream->data).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pcVar2)) {
    this->streamptr = uVar3;
    return pcVar2 + uVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attempt to read past end of file");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

char* readMemoryMapped (int n) override
    {
        if (n + streamptr > ostream.data.size ())
        {
            throw runtime_error ("attempt to read past end of file");
        }
        uint64_t oldStreamptr = streamptr;
        streamptr += n;
        return const_cast<char*> (ostream.data.data () + oldStreamptr);
    }